

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_bool nk_combo_begin_symbol_text
                  (nk_context *ctx,char *selected,int len,nk_symbol_type symbol,nk_vec2 size)

{
  nk_command_buffer *out;
  nk_vec2 nVar1;
  nk_window *win;
  nk_rect r;
  nk_widget_layout_states nVar2;
  nk_bool nVar3;
  long lVar4;
  nk_context *i;
  nk_style_combo *pnVar5;
  nk_color foreground;
  nk_bool nVar6;
  nk_color c;
  bool bVar7;
  float fVar8;
  float fVar9;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect content;
  nk_rect b;
  nk_rect header_00;
  nk_rect header;
  float local_f8;
  float fStack_f4;
  float local_d8;
  nk_text local_c8;
  float local_b8;
  float fStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  nk_rect local_98;
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  nk_rect local_50;
  nk_rect local_40;
  
  nVar6 = 0;
  nVar3 = 0;
  if (((ctx != (nk_context *)0x0) && (win = ctx->current, nVar3 = nVar6, win != (nk_window *)0x0))
     && (win->layout != (nk_panel *)0x0)) {
    local_68._8_4_ = in_XMM0_Dc;
    local_68._0_8_ = size;
    local_68._12_4_ = in_XMM0_Dd;
    nVar2 = nk_widget(&local_98,ctx);
    if (nVar2 != NK_WIDGET_INVALID) {
      i = ctx;
      if ((win->layout->flags & 0x1000) != 0) {
        i = (nk_context *)0x0;
      }
      if (nVar2 == NK_WIDGET_ROM) {
        i = (nk_context *)0x0;
      }
      r.w = local_98.w;
      r.h = local_98.h;
      r.x = local_98.x;
      r.y = local_98.y;
      local_a8 = local_98.h;
      fStack_a4 = local_a8;
      fStack_a0 = local_a8;
      fStack_9c = local_a8;
      local_b8 = (float)nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
      bVar7 = local_b8 != 0.0;
      if ((ctx->last_widget_state & 0x20) == 0) {
        if ((ctx->last_widget_state & 0x10) == 0) {
          pnVar5 = &(ctx->style).combo;
          local_c8.text = (ctx->style).combo.label_normal;
          foreground = (ctx->style).combo.symbol_normal;
        }
        else {
          pnVar5 = (nk_style_combo *)&(ctx->style).combo.hover;
          local_c8.text = (ctx->style).combo.label_hover;
          foreground = (ctx->style).combo.symbol_hover;
        }
      }
      else {
        pnVar5 = (nk_style_combo *)&(ctx->style).combo.active;
        local_c8.text = (ctx->style).combo.label_active;
        foreground = (ctx->style).combo.symbol_active;
      }
      if ((pnVar5->normal).type == NK_STYLE_ITEM_IMAGE) {
        r_00.w = local_98.w;
        r_00.h = local_98.h;
        r_00.x = local_98.x;
        r_00.y = local_98.y;
        nk_draw_image(&win->buffer,r_00,&(pnVar5->normal).data.image,(nk_color)0xffffffff);
        c.r = '\0';
        c.g = '\0';
        c.b = '\0';
        c.a = '\0';
      }
      else {
        c = (pnVar5->normal).data.color;
        rect.w = local_98.w;
        rect.h = local_98.h;
        rect.x = local_98.x;
        rect.y = local_98.y;
        nk_fill_rect(&win->buffer,rect,(ctx->style).combo.rounding,c);
        rect_00.w = local_98.w;
        rect_00.h = local_98.h;
        rect_00.x = local_98.x;
        rect_00.y = local_98.y;
        nk_stroke_rect(&win->buffer,rect_00,(ctx->style).combo.rounding,(ctx->style).combo.border,
                       (ctx->style).combo.border_color);
      }
      lVar4 = 0x1be4;
      if ((ctx->last_widget_state & 0x10) == 0) {
        lVar4 = (ulong)(local_b8 != 0.0) * 8 + 0x1be0;
      }
      fVar8 = (ctx->style).combo.button_padding.y;
      local_f8 = local_98.x;
      fStack_f4 = local_98.y;
      local_40.y = fStack_f4 + fVar8;
      local_40.w = local_a8 - (fVar8 + fVar8);
      local_d8 = local_98.w;
      local_b8 = ((local_f8 + local_d8) - local_a8) - (ctx->style).combo.button_padding.x;
      fStack_b4 = fStack_f4;
      uStack_b0 = 0;
      uStack_ac = 0;
      nVar1 = (ctx->style).combo.button.padding;
      fVar8 = nVar1.x;
      fVar9 = nVar1.y;
      local_50.x = local_b8 + fVar8;
      local_50.y = local_40.y + fVar9;
      local_50.w = local_40.w - (fVar8 + fVar8);
      local_50.h = local_40.w - (fVar9 + fVar9);
      out = &win->buffer;
      local_c8.background = c;
      local_40.x = local_b8;
      local_40.h = local_40.w;
      nk_draw_button_symbol
                (out,&local_40,&local_50,ctx->last_widget_state,&(ctx->style).combo.button,
                 *(nk_symbol_type *)((long)&(ctx->input).keyboard.keys[0].down + lVar4),
                 (ctx->style).font);
      nVar1 = (ctx->style).combo.content_padding;
      fVar8 = nVar1.y;
      local_88 = local_f8 + nVar1.x;
      fStack_84 = fStack_f4 + fVar8;
      uStack_80 = 0;
      uStack_7c = 0;
      content.w = local_a8 - (fVar8 + fVar8);
      fStack_74 = fStack_a4;
      fStack_70 = fStack_a0;
      fStack_6c = fStack_9c;
      content.y = fStack_84;
      content.x = local_88;
      content.h = content.w;
      local_78 = content.w;
      nk_draw_symbol(out,symbol,content,c,foreground,1.0,(ctx->style).font);
      local_c8.padding.x = 0.0;
      local_c8.padding.y = 0.0;
      nVar1 = (ctx->style).combo.content_padding;
      fVar8 = nVar1.x;
      fVar9 = nVar1.y;
      b.x = local_78 + local_88 + (ctx->style).combo.spacing.x + fVar8;
      b.y = fStack_f4 + fVar9;
      b.w = (local_b8 - fVar8) - b.x;
      b.h = local_a8 - (fVar9 + fVar9);
      nk_widget_text(out,b,selected,len,&local_c8,0x11,(ctx->style).font);
      header_00.w = local_98.w;
      header_00.h = local_98.h;
      header_00.x = local_98.x;
      header_00.y = local_98.y;
      nVar3 = nk_combo_begin(ctx,win,(nk_vec2)local_68._0_8_,(uint)bVar7,header_00);
    }
  }
  return nVar3;
}

Assistant:

NK_API nk_bool
nk_combo_begin_symbol_text(struct nk_context *ctx, const char *selected, int len,
enum nk_symbol_type symbol, struct nk_vec2 size)
{
struct nk_window *win;
struct nk_style *style;
struct nk_input *in;

struct nk_rect header;
int is_clicked = nk_false;
enum nk_widget_layout_states s;
const struct nk_style_item *background;
struct nk_color symbol_color;
struct nk_text text;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
style = &ctx->style;
s = nk_widget(&header, ctx);
if (!s) return 0;

in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
is_clicked = nk_true;

/* draw combo box header background and border */
if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
background = &style->combo.active;
symbol_color = style->combo.symbol_active;
text.text = style->combo.label_active;
} else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
background = &style->combo.hover;
symbol_color = style->combo.symbol_hover;
text.text = style->combo.label_hover;
} else {
background = &style->combo.normal;
symbol_color = style->combo.symbol_normal;
text.text = style->combo.label_normal;
}
if (background->type == NK_STYLE_ITEM_IMAGE) {
text.background = nk_rgba(0,0,0,0);
nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
} else {
text.background = background->data.color;
nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
}
{
struct nk_rect content;
struct nk_rect button;
struct nk_rect label;
struct nk_rect image;

enum nk_symbol_type sym;
if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
sym = style->combo.sym_hover;
else if (is_clicked)
sym = style->combo.sym_active;
else sym = style->combo.sym_normal;

/* calculate button */
button.w = header.h - 2 * style->combo.button_padding.y;
button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
button.y = header.y + style->combo.button_padding.y;
button.h = button.w;

content.x = button.x + style->combo.button.padding.x;
content.y = button.y + style->combo.button.padding.y;
content.w = button.w - 2 * style->combo.button.padding.x;
content.h = button.h - 2 * style->combo.button.padding.y;
nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
&ctx->style.combo.button, sym, style->font);

/* draw symbol */
image.x = header.x + style->combo.content_padding.x;
image.y = header.y + style->combo.content_padding.y;
image.h = header.h - 2 * style->combo.content_padding.y;
image.w = image.h;
nk_draw_symbol(&win->buffer, symbol, image, text.background, symbol_color,
1.0f, style->font);

/* draw label */
text.padding = nk_vec2(0,0);
label.x = image.x + image.w + style->combo.spacing.x + style->combo.content_padding.x;
label.y = header.y + style->combo.content_padding.y;
label.w = (button.x - style->combo.content_padding.x) - label.x;
label.h = header.h - 2 * style->combo.content_padding.y;
nk_widget_text(&win->buffer, label, selected, len, &text, NK_TEXT_LEFT, style->font);
}
return nk_combo_begin(ctx, win, size, is_clicked, header);
}